

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUICheckBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUICheckBox::draw(CGUICheckBox *this)

{
  undefined1 *puVar1;
  u32 uVar2;
  char cVar3;
  byte bVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  u32 uVar8;
  long *plVar9;
  long *plVar10;
  undefined8 *puVar11;
  int iVar12;
  char cVar13;
  undefined1 *puVar14;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  rect<int> frameRect;
  string<wchar_t> local_50;
  
  if (this->field_0xa0 == '\x01') {
    plVar9 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    if (plVar9 != (long *)0x0) {
      plVar10 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
      frameRect.UpperLeftCorner.X = *(int *)&this->field_0x40;
      frameRect.UpperLeftCorner.Y = *(int *)&this->field_0x44;
      frameRect.LowerRightCorner.X = *(int *)&this->field_0x48;
      frameRect.LowerRightCorner.Y = *(int *)&this->field_0x4c;
      if (this->Background == true) {
        uVar5 = (**(code **)*plVar9)(plVar9,2);
        (**(code **)(*plVar10 + 0x198))(plVar10,uVar5,&frameRect,&this->field_0x50);
      }
      if (this->Border == true) {
        (**(code **)(*plVar9 + 0x70))(plVar9,this,0,1,0,&frameRect,&this->field_0x50);
        iVar6 = (**(code **)(*plVar9 + 0x10))(plVar9,8);
        frameRect.UpperLeftCorner.X = frameRect.UpperLeftCorner.X + iVar6;
        iVar6 = (**(code **)(*plVar9 + 0x10))(plVar9,8);
        frameRect.LowerRightCorner.X = frameRect.LowerRightCorner.X - iVar6;
      }
      iVar6 = (**(code **)(*plVar9 + 0x10))(plVar9,3);
      iVar7 = (frameRect.LowerRightCorner.Y - iVar6) - frameRect.UpperLeftCorner.Y;
      iStack_74 = iVar7 / 2 + frameRect.UpperLeftCorner.Y;
      local_78 = frameRect.UpperLeftCorner.X;
      iStack_70 = frameRect.UpperLeftCorner.X + iVar6;
      iStack_6c = iStack_74 + iVar6;
      cVar3 = (**(code **)(*(long *)this + 0x90))
                        (this,frameRect.UpperLeftCorner.Y,(long)iVar7 % 2 & 0xffffffff);
      cVar13 = '\x17';
      if (cVar3 != '\0') {
        cVar13 = (this->Pressed & 1U) * '\x02' + '\x16';
      }
      uVar5 = (**(code **)*plVar9)(plVar9,cVar13);
      puVar1 = &this->field_0x50;
      puVar14 = puVar1;
      (**(code **)(*plVar9 + 0x70))(plVar9,this,uVar5,0,1,&local_78,puVar1);
      if (this->Checked == true) {
        iVar7 = iStack_70 + local_78;
        iVar12 = iStack_6c + iStack_74;
        uVar2 = this->CheckTime;
        uVar8 = os::Timer::getTime();
        (**(code **)(*plVar9 + 0xa0))
                  (plVar9,this,10,(long)iVar7 / 2 & 0xffffffffU | (long)iVar12 / 2 << 0x20,uVar2,
                   uVar8,(ulong)puVar14 & 0xffffffff00000000,puVar1);
      }
      if (*(int *)&this->field_0xb0 != 0) {
        iStack_74 = frameRect.UpperLeftCorner.Y;
        iStack_70 = frameRect.LowerRightCorner.X;
        iStack_6c = frameRect.LowerRightCorner.Y;
        local_78 = frameRect.UpperLeftCorner.X + iVar6 + 5;
        puVar11 = (undefined8 *)(**(code **)(*plVar9 + 0x30))(plVar9,0);
        if (puVar11 != (undefined8 *)0x0) {
          core::string<wchar_t>::string<wchar_t>(&local_50,*(wchar_t **)&this->field_0xa8);
          bVar4 = (**(code **)(*(long *)this + 0x90))(this);
          uVar5 = (**(code **)*plVar9)(plVar9,bVar4 ^ 9);
          (**(code **)*puVar11)(puVar11,&local_50,&local_78,uVar5,0,1,puVar1);
          ::std::__cxx11::wstring::_M_dispose();
        }
      }
    }
    IGUIElement::draw((IGUIElement *)this);
  }
  return;
}

Assistant:

void CGUICheckBox::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		video::IVideoDriver *driver = Environment->getVideoDriver();
		core::rect<s32> frameRect(AbsoluteRect);

		// draw background
		if (Background) {
			video::SColor bgColor = skin->getColor(gui::EGDC_3D_FACE);
			driver->draw2DRectangle(bgColor, frameRect, &AbsoluteClippingRect);
		}

		// draw the border
		if (Border) {
			skin->draw3DSunkenPane(this, 0, true, false, frameRect, &AbsoluteClippingRect);
			frameRect.UpperLeftCorner.X += skin->getSize(EGDS_TEXT_DISTANCE_X);
			frameRect.LowerRightCorner.X -= skin->getSize(EGDS_TEXT_DISTANCE_X);
		}

		const s32 height = skin->getSize(EGDS_CHECK_BOX_WIDTH);

		// the rectangle around the "checked" area.
		core::rect<s32> checkRect(frameRect.UpperLeftCorner.X,
				((frameRect.getHeight() - height) / 2) + frameRect.UpperLeftCorner.Y,
				0, 0);

		checkRect.LowerRightCorner.X = checkRect.UpperLeftCorner.X + height;
		checkRect.LowerRightCorner.Y = checkRect.UpperLeftCorner.Y + height;

		EGUI_DEFAULT_COLOR col = EGDC_GRAY_EDITABLE;
		if (isEnabled())
			col = Pressed ? EGDC_FOCUSED_EDITABLE : EGDC_EDITABLE;
		skin->draw3DSunkenPane(this, skin->getColor(col),
				false, true, checkRect, &AbsoluteClippingRect);

		// the checked icon
		if (Checked) {
			skin->drawIcon(this, EGDI_CHECK_BOX_CHECKED, checkRect.getCenter(),
					CheckTime, os::Timer::getTime(), false, &AbsoluteClippingRect);
		}

		// associated text
		if (Text.size()) {
			checkRect = frameRect;
			checkRect.UpperLeftCorner.X += height + 5;

			IGUIFont *font = skin->getFont();
			if (font) {
				font->draw(Text.c_str(), checkRect,
						skin->getColor(isEnabled() ? EGDC_BUTTON_TEXT : EGDC_GRAY_TEXT), false, true, &AbsoluteClippingRect);
			}
		}
	}
	IGUIElement::draw();
}